

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_add_neg_y_diff_x(void)

{
  int iVar1;
  secp256k1_ge res;
  secp256k1_gej resj;
  secp256k1_ge b;
  secp256k1_gej sumj;
  secp256k1_gej bj;
  secp256k1_gej aj;
  secp256k1_gej *in_stack_fffffffffffffd98;
  secp256k1_ge *in_stack_fffffffffffffda0;
  secp256k1_ge *in_stack_fffffffffffffdc8;
  secp256k1_gej *in_stack_fffffffffffffdd0;
  undefined1 local_180 [88];
  secp256k1_fe *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  secp256k1_fe *in_stack_fffffffffffffef8;
  secp256k1_gej *in_stack_ffffffffffffff00;
  secp256k1_gej *in_stack_ffffffffffffff08;
  secp256k1_gej *in_stack_ffffffffffffff10;
  secp256k1_ge *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_gej *in_stack_ffffffffffffff60;
  undefined1 local_80 [128];
  
  memcpy(local_80,&DAT_001656e0,0x80);
  memcpy(&stack0xffffffffffffff00,&DAT_00165760,0x80);
  memcpy(local_180,&DAT_001657e0,0x80);
  secp256k1_ge_set_gej(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf86,"test condition failed: secp256k1_gej_eq_ge_var(&sumj, &res)");
    abort();
  }
  secp256k1_gej_add_ge
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  secp256k1_ge_set_gej(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf8a,"test condition failed: secp256k1_gej_eq_ge_var(&sumj, &res)");
    abort();
  }
  secp256k1_gej_add_ge_var
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf8e,"test condition failed: secp256k1_gej_eq_ge_var(&sumj, &res)");
    abort();
  }
  return;
}

Assistant:

static void test_add_neg_y_diff_x(void) {
    /* The point of this test is to check that we can add two points
     * whose y-coordinates are negatives of each other but whose x
     * coordinates differ. If the x-coordinates were the same, these
     * points would be negatives of each other and their sum is
     * infinity. This is cool because it "covers up" any degeneracy
     * in the addition algorithm that would cause the xy coordinates
     * of the sum to be wrong (since infinity has no xy coordinates).
     * HOWEVER, if the x-coordinates are different, infinity is the
     * wrong answer, and such degeneracies are exposed. This is the
     * root of https://github.com/bitcoin-core/secp256k1/issues/257
     * which this test is a regression test for.
     *
     * These points were generated in sage as
     *
     * load("secp256k1_params.sage")
     *
     * # random "bad pair"
     * P = C.random_element()
     * Q = -int(LAMBDA) * P
     * print("    P: %x %x" % P.xy())
     * print("    Q: %x %x" % Q.xy())
     * print("P + Q: %x %x" % (P + Q).xy())
     */
    secp256k1_gej aj = SECP256K1_GEJ_CONST(
        0x8d24cd95, 0x0a355af1, 0x3c543505, 0x44238d30,
        0x0643d79f, 0x05a59614, 0x2f8ec030, 0xd58977cb,
        0x001e337a, 0x38093dcd, 0x6c0f386d, 0x0b1293a8,
        0x4d72c879, 0xd7681924, 0x44e6d2f3, 0x9190117d
    );
    secp256k1_gej bj = SECP256K1_GEJ_CONST(
        0xc7b74206, 0x1f788cd9, 0xabd0937d, 0x164a0d86,
        0x95f6ff75, 0xf19a4ce9, 0xd013bd7b, 0xbf92d2a7,
        0xffe1cc85, 0xc7f6c232, 0x93f0c792, 0xf4ed6c57,
        0xb28d3786, 0x2897e6db, 0xbb192d0b, 0x6e6feab2
    );
    secp256k1_gej sumj = SECP256K1_GEJ_CONST(
        0x671a63c0, 0x3efdad4c, 0x389a7798, 0x24356027,
        0xb3d69010, 0x278625c3, 0x5c86d390, 0x184a8f7a,
        0x5f6409c2, 0x2ce01f2b, 0x511fd375, 0x25071d08,
        0xda651801, 0x70e95caf, 0x8f0d893c, 0xbed8fbbe
    );
    secp256k1_ge b;
    secp256k1_gej resj;
    secp256k1_ge res;
    secp256k1_ge_set_gej(&b, &bj);

    secp256k1_gej_add_var(&resj, &aj, &bj, NULL);
    secp256k1_ge_set_gej(&res, &resj);
    CHECK(secp256k1_gej_eq_ge_var(&sumj, &res));

    secp256k1_gej_add_ge(&resj, &aj, &b);
    secp256k1_ge_set_gej(&res, &resj);
    CHECK(secp256k1_gej_eq_ge_var(&sumj, &res));

    secp256k1_gej_add_ge_var(&resj, &aj, &b, NULL);
    secp256k1_ge_set_gej(&res, &resj);
    CHECK(secp256k1_gej_eq_ge_var(&sumj, &res));
}